

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

Vector<int,_4> deqp::gles31::Functional::FboTestUtil::castVectorSaturate<int>(Vec4 *in)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int *in_RDI;
  int iVar5;
  Vector<int,_4> VVar6;
  
  fVar1 = in->m_data[0];
  uVar2 = 0x7fffffff;
  iVar3 = 0x7fffffff;
  if ((fVar1 + 0.5 < 2.1474836e+09) && (iVar3 = -0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    iVar3 = (int)fVar1;
  }
  fVar1 = in->m_data[1];
  if ((fVar1 + 0.5 < 2.1474836e+09) && (uVar2 = 0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    uVar2 = (ulong)(uint)(int)fVar1;
  }
  fVar1 = in->m_data[2];
  uVar4 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if ((fVar1 + 0.5 < 2.1474836e+09) && (iVar5 = -0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    iVar5 = (int)fVar1;
  }
  fVar1 = in->m_data[3];
  if ((fVar1 + 0.5 < 2.1474836e+09) && (uVar4 = 0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    uVar4 = (ulong)(uint)(int)fVar1;
  }
  *in_RDI = iVar3;
  in_RDI[1] = (int)uVar2;
  in_RDI[2] = iVar5;
  in_RDI[3] = (int)uVar4;
  VVar6.m_data[2] = (int)uVar4;
  VVar6.m_data[3] = (int)(uVar4 >> 0x20);
  VVar6.m_data[0] = (int)uVar2;
  VVar6.m_data[1] = (int)(uVar2 >> 0x20);
  return (Vector<int,_4>)VVar6.m_data;
}

Assistant:

T						y			(void) const { DE_STATIC_ASSERT(Size >= 2); return m_data[1]; }